

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  uint uVar1;
  sqlite3 *db;
  Table *pTVar2;
  void *p;
  u8 uVar3;
  ushort uVar4;
  u32 uVar5;
  Column *pCVar6;
  ExprList_item *pEVar7;
  Expr *pEVar8;
  Column *pCVar9;
  byte *pKey;
  HashElem *pHVar10;
  size_t sVar11;
  ulong uVar12;
  undefined1 *puVar13;
  i16 *extraout_RAX;
  i16 *piVar14;
  byte *pbVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  char *zIn;
  long lVar20;
  bool bVar21;
  u32 cnt;
  Hash ht;
  uint local_84;
  ExprList_item *local_80;
  uint local_74;
  Column *local_70;
  Column **local_68;
  i16 *local_60;
  Hash local_58;
  ulong local_40;
  ExprList_item *local_38;
  
  db = pParse->db;
  local_58.htsize = 0;
  local_58.count = 0;
  local_58.first = (HashElem *)0x0;
  local_58.ht = (_ht *)0x0;
  uVar19 = 0;
  local_68 = paCol;
  local_60 = pnCol;
  if (pEList == (ExprList *)0x0) {
    pCVar6 = (Column *)0x0;
    uVar17 = 0;
  }
  else {
    uVar1 = pEList->nExpr;
    pCVar6 = (Column *)sqlite3DbMallocZero(db,(long)(int)uVar1 << 4);
    uVar17 = 0x7fff;
    if ((int)uVar1 < 0x7fff) {
      uVar17 = uVar1;
    }
  }
  *local_60 = (i16)uVar17;
  *local_68 = pCVar6;
  local_70 = pCVar6;
  if (0 < (int)uVar17) {
    local_38 = pEList->a;
    local_40 = (ulong)uVar17;
    uVar19 = 0;
    local_74 = uVar17;
    do {
      if (pParse->nErr != 0) goto LAB_00178d08;
      local_80 = local_38 + uVar19;
      zIn = local_80->zEName;
      if ((zIn == (char *)0x0) || (((local_80->fg).field_0x1 & 3) != 0)) {
        pEVar8 = local_80->pExpr;
        while ((pEVar8 != (Expr *)0x0 && ((pEVar8->flags & 0x82000) != 0))) {
          if ((pEVar8->flags >> 0x13 & 1) == 0) {
            if (pEVar8->op != 'q') break;
            pEVar7 = (ExprList_item *)&pEVar8->pLeft;
          }
          else {
            pEVar7 = ((pEVar8->x).pList)->a;
          }
          pEVar8 = pEVar7->pExpr;
        }
        for (; (pEVar8 != (Expr *)0x0 && (pEVar8->op == 0x8d)); pEVar8 = pEVar8->pRight) {
        }
        if (pEVar8->op == ';') {
          pCVar9 = (Column *)&pEVar8->u;
LAB_00178b43:
          zIn = ((anon_union_8_2_443a03b8_for_u *)&pCVar9->zCnName)->zToken;
        }
        else if (((pEVar8->op == 0xa7) && ((pEVar8->flags & 0x3000000) == 0)) &&
                (pTVar2 = (pEVar8->y).pTab, pTVar2 != (Table *)0x0)) {
          uVar4 = pEVar8->iColumn;
          if ((short)uVar4 < 0) {
            uVar4 = pTVar2->iPKey;
          }
          zIn = "rowid";
          if (-1 < (short)uVar4) {
            pCVar9 = pTVar2->aCol + uVar4;
            goto LAB_00178b43;
          }
        }
      }
      if ((zIn == (char *)0x0) || (uVar5 = sqlite3IsTrueOrFalse(zIn), uVar5 != 0)) {
        pKey = (byte *)sqlite3MPrintf(db,"column%d",(ulong)((int)uVar19 + 1));
      }
      else {
        pKey = (byte *)sqlite3DbStrDup(db,zIn);
      }
      local_84 = 0;
LAB_00178b83:
      bVar21 = pKey != (byte *)0x0;
      if (bVar21) {
        pHVar10 = findElementWithHash(&local_58,(char *)pKey,(uint *)0x0);
        if (pHVar10->data != (void *)0x0) goto code_r0x00178bac;
        pCVar6->zCnName = (char *)pKey;
        if ((bVar21) && (bVar16 = *pKey, bVar16 != 0)) {
          uVar3 = '\0';
          pbVar15 = pKey;
          do {
            pbVar15 = pbVar15 + 1;
            uVar3 = uVar3 + ""[bVar16];
            bVar16 = *pbVar15;
          } while (bVar16 != 0);
          goto LAB_00178c77;
        }
      }
      else {
        pCVar6->zCnName = (char *)0x0;
      }
      uVar3 = '\0';
LAB_00178c77:
      pEVar7 = local_80;
      pCVar6->hName = uVar3;
      if (((local_80->fg).field_0x2 & 1) != 0) {
        pbVar15 = (byte *)((long)&pCVar6->colFlags + 1);
        *pbVar15 = *pbVar15 | 4;
      }
      if ((bVar21) &&
         (puVar13 = (undefined1 *)sqlite3HashInsert(&local_58,(char *)pKey,local_80),
         (ExprList_item *)puVar13 == pEVar7)) {
        sqlite3OomFault(db);
      }
      uVar19 = uVar19 + 1;
      pCVar6 = pCVar6 + 1;
    } while (uVar19 != local_40);
    uVar19 = (ulong)local_74;
  }
LAB_00178d08:
  sqlite3HashClear(&local_58);
  pCVar6 = local_70;
  piVar14 = extraout_RAX;
  if (pParse->nErr != 0) {
    if ((int)uVar19 != 0) {
      lVar20 = 0;
      do {
        p = *(void **)((long)&pCVar6->zCnName + lVar20);
        if (p != (void *)0x0) {
          sqlite3DbFreeNN(db,p);
        }
        lVar20 = lVar20 + 0x10;
      } while ((uVar19 & 0xffffffff) << 4 != lVar20);
    }
    if (pCVar6 != (Column *)0x0) {
      sqlite3DbFreeNN(db,pCVar6);
    }
    *local_68 = (Column *)0x0;
    *local_60 = 0;
    piVar14 = local_60;
  }
  return (int)piVar14;
code_r0x00178bac:
  if ((*(byte *)((long)pHVar10->data + 0x11) & 0x80) != 0) {
    pbVar15 = (byte *)((long)&pCVar6->colFlags + 1);
    *pbVar15 = *pbVar15 | 4;
  }
  sVar11 = strlen((char *)pKey);
  if ((sVar11 & 0x3fffffff) == 0) {
    uVar18 = 0;
  }
  else {
    uVar12 = (ulong)((uint)sVar11 & 0x3fffffff);
    do {
      if ((long)uVar12 < 2) {
        uVar12 = 0;
        break;
      }
      lVar20 = uVar12 - 1;
      uVar12 = uVar12 - 1;
    } while (0xfffffffffffffff5 < (ulong)pKey[lVar20] - 0x3a);
    uVar18 = (ulong)((uint)sVar11 & 0x3fffffff);
    if (pKey[uVar12 & 0xffffffff] == 0x3a) {
      uVar18 = uVar12 & 0xffffffff;
    }
  }
  local_84 = local_84 + 1;
  pKey = (byte *)sqlite3MPrintf(db,"%.*z:%u",uVar18,pKey);
  sqlite3ProgressCheck(pParse);
  if (3 < local_84) {
    sqlite3_randomness(4,&local_84);
  }
  goto LAB_00178b83;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */
  Table *pTab;

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( NEVER(nCol>32767) ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !pParse->nErr; i++, pCol++){
    struct ExprList_item *pX = &pEList->a[i];
    struct ExprList_item *pCollide;
    /* Get an appropriate name for the column
    */
    if( (zName = pX->zEName)!=0 && pX->fg.eEName==ENAME_NAME ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollateAndLikely(pX->pExpr);
      while( ALWAYS(pColExpr!=0) && pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN
       && ALWAYS( ExprUseYTab(pColExpr) )
       && ALWAYS( pColExpr->y.pTab!=0 )
      ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->y.pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zCnName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        assert( zName==pX->zEName );  /* pointer comparison intended */
      }
    }
    if( zName && !sqlite3IsTrueOrFalse(zName) ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && (pCollide = sqlite3HashFind(&ht, zName))!=0 ){
      if( pCollide->fg.bUsingTerm ){
        pCol->colFlags |= COLFLAG_NOEXPAND;
      }
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      sqlite3ProgressCheck(pParse);
      if( cnt>3 ){
        sqlite3_randomness(sizeof(cnt), &cnt);
      }
    }
    pCol->zCnName = zName;
    pCol->hName = sqlite3StrIHash(zName);
    if( pX->fg.bNoExpand ){
      pCol->colFlags |= COLFLAG_NOEXPAND;
    }
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pX)==pX ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( pParse->nErr ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zCnName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return pParse->rc;
  }
  return SQLITE_OK;
}